

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void ComputeHistogramCost(VP8LHistogram *h)

{
  uint64_t uVar1;
  long in_RDI;
  int length;
  uint32_t *population;
  uint8_t *in_stack_00000018;
  int i;
  int in_stack_0000002c;
  uint32_t *in_stack_00000030;
  int *in_stack_ffffffffffffffd8;
  uint32_t **in_stack_ffffffffffffffe0;
  HistogramIndex in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < 5; iVar2 = iVar2 + 1) {
    GetPopulationInfo((VP8LHistogram *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                      in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
    ;
    uVar1 = PopulationCost(in_stack_00000030,in_stack_0000002c,(uint16_t *)h,in_stack_00000018);
    *(uint64_t *)(in_RDI + 0xcc0 + (long)iVar2 * 8) = uVar1;
  }
  *(long *)(in_RDI + 0xcb8) =
       *(long *)(in_RDI + 0xcc0) + *(long *)(in_RDI + 0xcc8) + *(long *)(in_RDI + 0xcd0) +
       *(long *)(in_RDI + 0xcd8) + *(long *)(in_RDI + 0xce0);
  return;
}

Assistant:

static void ComputeHistogramCost(VP8LHistogram* const h) {
  int i;
  // No need to add the extra cost for length and distance as it is a constant
  // that does not influence the histograms.
  for (i = 0; i < 5; ++i) {
    const uint32_t* population;
    int length;
    GetPopulationInfo(h, i, &population, &length);
    h->costs[i] = PopulationCost(population, length, &h->trivial_symbol[i],
                                 &h->is_used[i]);
  }
  h->bit_cost = h->costs[LITERAL] + h->costs[RED] + h->costs[BLUE] +
                h->costs[ALPHA] + h->costs[DISTANCE];
}